

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_mutex.cpp
# Opt level: O2

void __thiscall SharedMutex::SharedMutex(SharedMutex *this)

{
  _Alloc_hider __p;
  int iVar1;
  __pid_t _Var2;
  ContextManager *pCVar3;
  pthread_mutexattr_t mutexattr;
  string local_30;
  
  (this->mutex_)._M_t.
  super___uniq_ptr_impl<SharedMemoryObject<pthread_mutex_t>,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_SharedMemoryObject<pthread_mutex_t>_*,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
  .super__Head_base<0UL,_SharedMemoryObject<pthread_mutex_t>_*,_false>._M_head_impl =
       (SharedMemoryObject<pthread_mutex_t> *)0x0;
  std::make_unique<SharedMemoryObject<pthread_mutex_t>>();
  __p._M_p = local_30._M_dataplus._M_p;
  local_30._M_dataplus._M_p = (pointer)0x0;
  std::
  __uniq_ptr_impl<SharedMemoryObject<pthread_mutex_t>,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
  ::reset((__uniq_ptr_impl<SharedMemoryObject<pthread_mutex_t>,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
           *)this,(pointer)__p._M_p);
  std::
  unique_ptr<SharedMemoryObject<pthread_mutex_t>,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
  ::~unique_ptr((unique_ptr<SharedMemoryObject<pthread_mutex_t>,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
                 *)&local_30);
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&mutexattr);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Failed to initialize mutexattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  iVar1 = pthread_mutexattr_setpshared((pthread_mutexattr_t *)&mutexattr,1);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Failed to set PTHREAD_PROCESS_SHARED to mutexattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  iVar1 = pthread_mutex_init((pthread_mutex_t *)
                             ((this->mutex_)._M_t.
                              super___uniq_ptr_impl<SharedMemoryObject<pthread_mutex_t>,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_SharedMemoryObject<pthread_mutex_t>_*,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
                              .super__Head_base<0UL,_SharedMemoryObject<pthread_mutex_t>_*,_false>.
                             _M_head_impl)->ptr_,(pthread_mutexattr_t *)&mutexattr);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Failed to initialize mutex: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  iVar1 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&mutexattr);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Failed to destroy mutexattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  _Var2 = getpid();
  this->owner_pid_ = _Var2;
  return;
}

Assistant:

SharedMutex::SharedMutex() {
    mutex_ = std::make_unique<SharedMemoryObject<pthread_mutex_t>>();
    pthread_mutexattr_t mutexattr;
    if (pthread_mutexattr_init(&mutexattr) != 0) {
        die(format("Failed to initialize mutexattr: %m"));
    }
    if (pthread_mutexattr_setpshared(&mutexattr, PTHREAD_PROCESS_SHARED) != 0) {
        die(format("Failed to set PTHREAD_PROCESS_SHARED to mutexattr: %m"));
    }
    if (pthread_mutex_init(mutex_->get(), &mutexattr)) {
        die(format("Failed to initialize mutex: %m"));
    }
    if (pthread_mutexattr_destroy(&mutexattr) != 0) {
        die(format("Failed to destroy mutexattr: %m"));
    }
    owner_pid_ = getpid();
}